

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O3

void rw::gl3::writeNativeTexture(Texture *tex,Stream *stream)

{
  char cVar1;
  byte bVar2;
  Raster *this;
  uint32 uVar3;
  uint8 *puVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int level;
  
  this = tex->raster;
  lVar9 = (long)nativeRasterOffset;
  uVar3 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar3 - 0xc);
  Stream::writeU32(stream,0xc);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  cVar1 = *(char *)((long)&this->width + lVar9 + 3);
  Stream::writeI32(stream,this->format);
  Stream::writeI32(stream,this->width);
  Stream::writeI32(stream,this->height);
  Stream::writeI32(stream,this->depth);
  Stream::writeI32(stream,(int)cVar1);
  bVar2 = *(byte *)((long)&this->width + lVar9 + 1);
  uVar8 = bVar2 + 2;
  if (*(char *)((long)&this->width + lVar9) == '\0') {
    uVar8 = (uint)bVar2;
  }
  Stream::writeI32(stream,gl3Caps);
  Stream::writeI32(stream,uVar8);
  level = 0;
  Stream::writeI32(stream,0);
  if ('\0' < cVar1) {
    do {
      uVar8 = this->originalHeight;
      iVar5 = this->originalStride;
      if (level != 0) {
        uVar6 = this->originalWidth;
        iVar7 = level;
        do {
          if (1 < (int)uVar6) {
            uVar6 = uVar6 >> 1;
            iVar5 = iVar5 / 2;
          }
          uVar8 = uVar8 >> (1 < (int)uVar8);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      Stream::writeU32(stream,uVar8 * iVar5);
      puVar4 = Raster::lock(this,level,2);
      (*stream->_vptr_Stream[3])(stream,puVar4,(ulong)(uVar8 * iVar5));
      Raster::unlock(this,level);
      level = level + 1;
    } while (level != cVar1);
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_GL3);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	int32 numLevels = natras->numLevels;
	stream->writeI32(raster->format);
	stream->writeI32(raster->width);
	stream->writeI32(raster->height);
	stream->writeI32(raster->depth);
	stream->writeI32(numLevels);

	// Native raster
	int32 flags = 0;
	int32 compression = 0;
	if(natras->hasAlpha)
		flags |= 1;
	if(natras->isCompressed){
		flags |= 2;
		switch(natras->internalFormat){
#ifdef RW_OPENGL
		case GL_COMPRESSED_RGBA_S3TC_DXT1_EXT:
		case GL_COMPRESSED_RGB_S3TC_DXT1_EXT:
			compression = 1;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT3_EXT:
			compression = 3;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT5_EXT:
			compression = 5;
			break;
#endif
		default:
			assert(0 && "unknown compression");
		}
	}
	stream->writeI32(gl3Caps.gles);
	stream->writeI32(flags);
	stream->writeI32(compression);
	// TODO: auto mipmaps?

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}